

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O0

void __thiscall tinyusdz::crate::CrateReader::~CrateReader(CrateReader *this)

{
  CrateReader *this_local;
  
  ::std::
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  ::~unordered_set(&this->unpackRecursionGuard);
  ::std::__cxx11::string::~string((string *)&this->_warn);
  ::std::__cxx11::string::~string((string *)&this->_err);
  ::std::
  map<tinyusdz::crate::Index,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>_>_>,_std::less<tinyusdz::crate::Index>,_std::allocator<std::pair<const_tinyusdz::crate::Index,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>_>_>_>_>_>
  ::~map(&this->_live_fieldsets);
  ::std::
  vector<tinyusdz::crate::CrateReader::Node,_std::allocator<tinyusdz::crate::CrateReader::Node>_>::
  ~vector(&this->_nodes);
  ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector(&this->_elemPaths);
  ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector(&this->_paths);
  ::std::vector<tinyusdz::crate::Spec,_std::allocator<tinyusdz::crate::Spec>_>::~vector
            (&this->_specs);
  ::std::vector<tinyusdz::crate::Index,_std::allocator<tinyusdz::crate::Index>_>::~vector
            (&this->_fieldset_indices);
  ::std::vector<tinyusdz::crate::Field,_std::allocator<tinyusdz::crate::Field>_>::~vector
            (&this->_fields);
  ::std::vector<tinyusdz::crate::Index,_std::allocator<tinyusdz::crate::Index>_>::~vector
            (&this->_string_indices);
  ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::~vector(&this->_tokens);
  TableOfContents::~TableOfContents(&this->_toc);
  return;
}

Assistant:

CrateReader::~CrateReader() {
  //delete _impl;
  //_impl = nullptr;
}